

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_booleani_v(NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLboolean local_11;
  GLint maxUniformBufferBindings;
  GLboolean data;
  NegativeTestContext *ctx_local;
  
  local_11 = 0xff;
  local_18 = 0;
  _maxUniformBufferBindings = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target is not indexed state queriable with these commands."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetBooleani_v
            (&_maxUniformBufferBindings->super_CallLogWrapper,0xffffffff,0,&local_11);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0x500);
  NegativeTestContext::endSection(_maxUniformBufferBindings);
  this = _maxUniformBufferBindings;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target."
             ,&local_71);
  NegativeTestContext::beginSection(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glGetIntegerv
            (&_maxUniformBufferBindings->super_CallLogWrapper,0x8a2f,(GLint *)&local_18);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0);
  glu::CallLogWrapper::glGetBooleani_v
            (&_maxUniformBufferBindings->super_CallLogWrapper,0x8a28,local_18,&local_11);
  NegativeTestContext::expectError(_maxUniformBufferBindings,0x501);
  NegativeTestContext::endSection(_maxUniformBufferBindings);
  return;
}

Assistant:

void get_booleani_v (NegativeTestContext& ctx)
{
	GLboolean	data						= -1;
	GLint		maxUniformBufferBindings	= 0;

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not indexed state queriable with these commands.");
	ctx.glGetBooleani_v(-1, 0, &data);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target.");
	ctx.glGetIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &maxUniformBufferBindings);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetBooleani_v(GL_UNIFORM_BUFFER_BINDING, maxUniformBufferBindings, &data);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}